

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta)

{
  int bkmin;
  row_iterator prVar1;
  double x_00;
  bool bVar2;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> *pprVar3;
  __tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_> *pprVar4;
  pointer begin;
  pointer prVar5;
  type pbVar6;
  type prVar7;
  type args_1;
  type prVar8;
  bool local_101;
  undefined1 auStack_c0 [7];
  bool pi_change;
  string_view local_b0;
  int local_9c;
  undefined1 auStack_98 [4];
  int i;
  int local_84;
  int iStack_80;
  int selected;
  rc_size sizes;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_5c;
  undefined1 auStack_58 [4];
  int k;
  bool local_41;
  double dStack_40;
  bool at_least_one_pi_changed;
  double theta_local;
  double delta_local;
  double kappa_local;
  bit_array *x_local;
  solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
  *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  local_41 = false;
  dStack_40 = theta;
  theta_local = delta;
  delta_local = kappa;
  kappa_local = (double)x;
  x_local = (bit_array *)this;
  this_local = (solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                *)last._M_current;
  last_local = first;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,"update-row {} {} {}\n")
  ;
  debug_logger<false>::log<double,double,double>
            ((debug_logger<false> *)this,_auStack_58,&delta_local,&theta_local,
             &stack0xffffffffffffffc0);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                      (&last_local,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &this_local);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_5c = constraint<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (last_local);
    sparse_matrix<int>::row((sparse_matrix<int> *)&sizes,(int)this + 0x10);
    pprVar3 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    prVar1 = *pprVar3;
    pprVar4 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
    ::decrease_preference
              ((solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                *)this,prVar1,*pprVar4,dStack_40);
    pprVar3 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    prVar1 = *pprVar3;
    pprVar4 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    _iStack_80 = solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                 ::compute_reduced_costs<baryonyx::bit_array>
                           ((solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                             *)this,prVar1,*pprVar4,(bit_array *)kappa_local);
    begin = std::
            unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
            ::get((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                   *)(this + 0x68));
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
             ::get((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                    *)(this + 0x68));
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>
              (begin,prVar5 + iStack_80,*(random_engine **)(this + 8));
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_5c);
    bkmin = pbVar6->min;
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_5c);
    local_84 = solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
               ::select_variables((solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                                   *)this,(rc_size *)&stack0xffffffffffffff80,bkmin,pbVar6->max);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_98,
               "constraints {}: {} <= ");
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_5c);
    debug_logger<false>::log<int,int>
              ((debug_logger<false> *)this,_auStack_98,&local_5c,&pbVar6->min);
    for (local_9c = 0; local_9c < iStack_80; local_9c = local_9c + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_b0,"{} ({} {}) ");
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                             *)(this + 0x68),(long)local_9c);
      args_1 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                             *)(this + 0x68),(long)local_9c);
      prVar8 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                             *)(this + 0x68),(long)local_9c);
      debug_logger<false>::log<int,double,int>
                ((debug_logger<false> *)this,local_b0,&prVar7->f,&args_1->value,&prVar8->id);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c0,
               "<= {} => Selected: {}\n");
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_5c);
    debug_logger<false>::log<int,int>
              ((debug_logger<false> *)this,_auStack_c0,&pbVar6->max,&local_84);
    x_00 = kappa_local;
    pprVar3 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    bVar2 = affect<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                      ((solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                        *)this,(bit_array *)x_00,*pprVar3,local_5c,local_84,iStack_80,delta_local,
                       theta_local);
    local_101 = true;
    if ((local_41 & 1U) == 0) {
      local_101 = bVar2;
    }
    local_41 = local_101;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&last_local);
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }